

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

SegmentBase<Memory::PreReservedVirtualAllocWrapper> * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AllocSegment(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               *this,size_t pageCount)

{
  undefined4 *puVar1;
  HANDLE pVVar2;
  code *pcVar3;
  bool bVar4;
  SegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_00;
  HANDLE pVVar5;
  undefined8 *in_FS_OFFSET;
  
  if (this->isClosed == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x4a6,"(!isClosed)","!isClosed");
    if (!bVar4) goto LAB_002794a6;
    *puVar1 = 0;
  }
  bVar4 = ValidThreadAccess(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x4a7,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar4) goto LAB_002794a6;
    *puVar1 = 0;
  }
  this->isUsed = true;
  this_00 = DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>::
            PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>*,unsigned_long,bool>
                      ((DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>
                        *)&this->largeSegments,
                       (NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,this,pageCount,
                       this->enableWriteBarrier);
  if (this_00 != (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
    bVar4 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::Initialize
                      (this_00,this->allocFlags | 0x1000,this->excludeGuardPages);
    if (bVar4) {
      LogAllocSegment(this,this_00);
      LogAllocPages(this,this_00->segmentPageCount);
      PageTracking::ReportAllocation
                ((PageAllocator *)this,this_00->address,this_00->segmentPageCount << 0xc);
      if (this->verifyEnabled != true) {
        return this_00;
      }
      pVVar2 = this->processHandle;
      pVVar5 = GetCurrentProcess();
      if (pVVar2 != pVVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x4c0,"(this->processHandle == GetCurrentProcess())",
                           "this->processHandle == GetCurrentProcess()");
        if (!bVar4) {
LAB_002794a6:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar1 = 0;
      }
      memset(this_00->address,0xca,this_00->segmentPageCount << 0xc);
      return this_00;
    }
    DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
    RemoveHead<Memory::NoThrowHeapAllocator>
              (&this->largeSegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
  }
  return (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0;
}

Assistant:

TSegment *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AllocSegment(size_t pageCount)
{
    Assert(!isClosed);
    ASSERT_THREAD();

    // Even though we don't idle decommit large segments, we still need to consider these allocations
    // as using the page allocator
    this->isUsed = true;

    TSegment * segment = largeSegments.PrependNode(&NoThrowNoMemProtectHeapAllocator::Instance,
        this, pageCount, enableWriteBarrier);
    if (segment == nullptr)
    {
        return nullptr;
    }
    if (!segment->Initialize(MEM_COMMIT | allocFlags, excludeGuardPages))
    {
        largeSegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);
        return nullptr;
    }

    LogAllocSegment(segment);
    LogAllocPages(segment->GetPageCount());

    PageTracking::ReportAllocation((PageAllocator*)this, segment->GetAddress(), AutoSystemInfo::PageSize * segment->GetPageCount());
#ifdef RECYCLER_MEMORY_VERIFY
    if (verifyEnabled)
    {
        Assert(this->processHandle == GetCurrentProcess());
        memset(segment->GetAddress(), Recycler::VerifyMemFill, AutoSystemInfo::PageSize * segment->GetPageCount());
    }
#endif

    return segment;
}